

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmCommonTargetGenerator::GetLinkedTargetDirectories
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmCommonTargetGenerator *this,string *config)

{
  bool bVar1;
  TargetType TVar2;
  uint uVar3;
  cmComputeLinkInformation *this_00;
  ItemVector *this_01;
  string *str;
  cmGlobalGenerator *pcVar4;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar5;
  byte local_211;
  cmAlphaNum local_1e8;
  cmAlphaNum local_1b8;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  cmAlphaNum local_148;
  cmAlphaNum local_118;
  undefined1 local_e8 [8];
  string di;
  cmLocalGenerator *lg;
  cmGeneratorTarget *local_a0;
  cmGeneratorTarget *linkee;
  Item *item;
  const_iterator __end2;
  const_iterator __begin2;
  ItemVector *__range2;
  ItemVector *items;
  cmComputeLinkInformation *cli;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  emitted;
  string *config_local;
  cmCommonTargetGenerator *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *dirs;
  
  emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  std::
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::set((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
         *)&cli);
  this_00 = cmGeneratorTarget::GetLinkInformation(this->GeneratorTarget,config);
  if (this_00 != (cmComputeLinkInformation *)0x0) {
    this_01 = cmComputeLinkInformation::GetItems(this_00);
    __end2 = std::
             vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
             ::begin(this_01);
    item = (Item *)std::
                   vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                   ::end(this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                                       *)&item), bVar1) {
      linkee = (cmGeneratorTarget *)
               __gnu_cxx::
               __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
               ::operator*(&__end2);
      local_a0 = *(cmGeneratorTarget **)((long)&(linkee->ObjectDirectory).field_2 + 8);
      local_211 = 0;
      if (local_a0 != (cmGeneratorTarget *)0x0) {
        bVar1 = cmGeneratorTarget::IsImported(local_a0);
        local_211 = 0;
        if (!bVar1) {
          TVar2 = cmGeneratorTarget::GetType(local_a0);
          local_211 = 0;
          if (TVar2 != INTERFACE_LIBRARY) {
            pVar5 = std::
                    set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                    ::insert((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                              *)&cli,&local_a0);
            local_211 = pVar5.second;
          }
        }
      }
      if ((local_211 & 1) != 0) {
        di.field_2._8_8_ = cmGeneratorTarget::GetLocalGenerator(local_a0);
        str = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                        ((cmLocalGenerator *)di.field_2._8_8_);
        cmAlphaNum::cmAlphaNum(&local_118,str);
        cmAlphaNum::cmAlphaNum(&local_148,'/');
        (**(code **)(*(long *)di.field_2._8_8_ + 0x70))(&local_168,di.field_2._8_8_,local_a0);
        cmStrCat<std::__cxx11::string>((string *)local_e8,&local_118,&local_148,&local_168);
        std::__cxx11::string::~string((string *)&local_168);
        pcVar4 = cmLocalGenerator::GetGlobalGenerator((cmLocalGenerator *)di.field_2._8_8_);
        uVar3 = (*pcVar4->_vptr_cmGlobalGenerator[0x26])();
        if ((uVar3 & 1) != 0) {
          cmAlphaNum::cmAlphaNum(&local_1b8,(string *)local_e8);
          cmAlphaNum::cmAlphaNum(&local_1e8,'/');
          cmStrCat<std::__cxx11::string>(&local_188,&local_1b8,&local_1e8,config);
          std::__cxx11::string::operator=((string *)local_e8,(string *)&local_188);
          std::__cxx11::string::~string((string *)&local_188);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)local_e8);
        std::__cxx11::string::~string((string *)local_e8);
      }
      __gnu_cxx::
      __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
      ::operator++(&__end2);
    }
  }
  emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
  std::
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::~set((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *)&cli);
  if ((emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmCommonTargetGenerator::GetLinkedTargetDirectories(
  const std::string& config) const
{
  std::vector<std::string> dirs;
  std::set<cmGeneratorTarget const*> emitted;
  if (cmComputeLinkInformation* cli =
        this->GeneratorTarget->GetLinkInformation(config)) {
    cmComputeLinkInformation::ItemVector const& items = cli->GetItems();
    for (auto const& item : items) {
      cmGeneratorTarget const* linkee = item.Target;
      if (linkee &&
          !linkee->IsImported()
          // We can ignore the INTERFACE_LIBRARY items because
          // Target->GetLinkInformation already processed their
          // link interface and they don't have any output themselves.
          && linkee->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
          emitted.insert(linkee).second) {
        cmLocalGenerator* lg = linkee->GetLocalGenerator();
        std::string di = cmStrCat(lg->GetCurrentBinaryDirectory(), '/',
                                  lg->GetTargetDirectory(linkee));
        if (lg->GetGlobalGenerator()->IsMultiConfig()) {
          di = cmStrCat(di, '/', config);
        }
        dirs.push_back(std::move(di));
      }
    }
  }
  return dirs;
}